

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O1

void __thiscall w3SourceGen::push_i32(w3SourceGen *this,int i)

{
  size_t sVar1;
  w3SourceGenValue sourceGenValue;
  char s [99];
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  char local_88 [104];
  
  sprintf(local_88,"%d",i);
  local_b0[0] = Tag_i32;
  local_a8._M_p = (pointer)&local_98;
  sVar1 = strlen(local_88);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,local_88,local_88 + sVar1);
  std::deque<w3SourceGenValue,_std::allocator<w3SourceGenValue>_>::push_back
            ((deque<w3SourceGenValue,_std::allocator<w3SourceGenValue>_> *)&this->stack,
             (value_type *)local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p != &local_98) {
    operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void push_i32 (int i)
    {
        char s[99];
        sprintf(s, "%d", i); // TODO C vs. Rust TODO perf
        w3SourceGenValue sourceGenValue = {Tag_i32, s};
        stack.push(sourceGenValue);
    }